

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O0

QDebug operator<<(QDebug *d,QDnsLookupRunnable *r)

{
  bool bVar1;
  quint16 qVar2;
  qsizetype qVar3;
  QDebug *o;
  long in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffff68;
  unsigned_short in_stack_ffffffffffffff6e;
  undefined4 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  undefined2 in_stack_ffffffffffffff76;
  QByteArray *in_stack_ffffffffffffff78;
  QByteArray *in_stack_ffffffffffffff80;
  Stream *pSVar4;
  QDebug *dbg;
  Data *in_stack_ffffffffffffffb8;
  QDebug local_30;
  QDebug local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar4 = in_RDI;
  dbg = in_RSI;
  QByteArray::left(in_stack_ffffffffffffff80,(qsizetype)in_RSI);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QByteArray::~QByteArray((QByteArray *)0x344853);
  qVar3 = QByteArray::size((QByteArray *)(in_RDX + 0x20));
  if (0xff < qVar3) {
    QDebug::operator<<((QDebug *)in_RDI,(char *)in_stack_ffffffffffffffb8);
  }
  o = QDebug::operator<<((QDebug *)in_RDI,(char *)in_stack_ffffffffffffffb8);
  QDebug::QDebug(&local_30,o);
  operator<<(dbg,(Type)((ulong)pSVar4 >> 0x20));
  QDebug::~QDebug(local_28);
  QDebug::~QDebug(&local_30);
  bVar1 = QHostAddress::isNull((QHostAddress *)0x3448d1);
  if (!bVar1) {
    QDebug::operator<<((QDebug *)in_RDI,(char *)in_stack_ffffffffffffffb8);
    QHostAddress::toString((QHostAddress *)in_RDI);
    QtPrivate::asString((QString *)&stack0xffffffffffffffb8);
    QString::utf16();
    QDebug::operator<<((QDebug *)
                       CONCAT26(in_stack_ffffffffffffff76,
                                CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
                       (void *)CONCAT26(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68));
    QDebug::operator<<((QDebug *)in_RDI,(char *)in_stack_ffffffffffffffb8);
    if (*(short *)(in_RDX + 0x44) == 0) {
      qVar2 = QDnsLookup::defaultPortForProtocol(*(Protocol *)(in_RDX + 0x46));
    }
    else {
      qVar2 = *(quint16 *)(in_RDX + 0x44);
    }
    QDebug::operator<<((QDebug *)
                       CONCAT26(qVar2,CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
                       ,in_stack_ffffffffffffff6e);
    QString::~QString((QString *)0x344980);
    if ((*(char *)(in_RDX + 0x46) != '\0') && (*(char *)(in_RDX + 0x46) == '\x01')) {
      QDebug::operator<<((QDebug *)in_RDI,(char *)in_stack_ffffffffffffffb8);
    }
  }
  QDebug::QDebug((QDebug *)in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)pSVar4;
}

Assistant:

inline QDebug operator<<(QDebug &d, QDnsLookupRunnable *r)
{
    // continued: print the information about the request
    d << r->requestName.left(MaxDomainNameLength);
    if (r->requestName.size() > MaxDomainNameLength)
        d << "... (truncated)";
    d << " type " << r->requestType;
    if (!r->nameserver.isNull()) {
        d << " to nameserver " << qUtf16Printable(r->nameserver.toString())
          << " port " << (r->port ? r->port : QDnsLookup::defaultPortForProtocol(r->protocol));
        switch (r->protocol) {
        case QDnsLookup::Standard:
            break;
        case QDnsLookup::DnsOverTls:
            d << " (TLS)";
        }
    }
    return d;
}